

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O3

void __thiscall Ptex::v2_2::PtexSeparableKernel::stripZeros(PtexSeparableKernel *this)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  float *pfVar4;
  int iVar5;
  
  pfVar4 = this->ku;
  if ((*pfVar4 != 0.0) || (NAN(*pfVar4))) {
    iVar3 = this->uw;
  }
  else {
    iVar5 = this->u;
    iVar3 = this->uw;
    do {
      iVar5 = iVar5 + 1;
      iVar3 = iVar3 + -1;
      pfVar1 = pfVar4 + 1;
      pfVar4 = pfVar4 + 1;
    } while (*pfVar1 == 0.0);
    this->ku = pfVar4;
    this->u = iVar5;
    this->uw = iVar3;
  }
  if ((pfVar4[(long)iVar3 + -1] == 0.0) && (!NAN(pfVar4[(long)iVar3 + -1]))) {
    pfVar4 = pfVar4 + (long)iVar3 + -2;
    do {
      fVar2 = *pfVar4;
      iVar3 = iVar3 + -1;
      pfVar4 = pfVar4 + -1;
    } while (fVar2 == 0.0);
    this->uw = iVar3;
  }
  pfVar4 = this->kv;
  if ((*pfVar4 != 0.0) || (NAN(*pfVar4))) {
    iVar3 = this->vw;
  }
  else {
    iVar5 = this->v;
    iVar3 = this->vw;
    do {
      iVar5 = iVar5 + 1;
      iVar3 = iVar3 + -1;
      pfVar1 = pfVar4 + 1;
      pfVar4 = pfVar4 + 1;
    } while (*pfVar1 == 0.0);
    this->kv = pfVar4;
    this->v = iVar5;
    this->vw = iVar3;
  }
  if ((pfVar4[(long)iVar3 + -1] == 0.0) && (!NAN(pfVar4[(long)iVar3 + -1]))) {
    pfVar4 = pfVar4 + (long)iVar3 + -2;
    do {
      fVar2 = *pfVar4;
      iVar3 = iVar3 + -1;
      pfVar4 = pfVar4 + -1;
    } while (fVar2 == 0.0);
    this->vw = iVar3;
  }
  return;
}

Assistant:

void stripZeros()
    {
        while (ku[0] == 0) { ku++; u++; uw--; }
        while (ku[uw-1] == 0) { uw--; }
        while (kv[0] == 0) { kv++; v++; vw--; }
        while (kv[vw-1] == 0) { vw--; }
        assert(uw > 0 && vw > 0);
    }